

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::FunctionValidator
          (FunctionValidator *this,Module *wasm,ValidationInfo *info)

{
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_Pass.runner = (PassRunner *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_Pass.name._M_dataplus._M_p =
       (pointer)&(this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).super_Pass.name.field_2;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_Pass.name._M_string_length = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_Pass.name.field_2._M_local_buf[0] = '\0';
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.replacep =
       (Expression **)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.stack.
  usedFixed = 0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.stack.
  flexible.
  super__Vector_base<wasm::Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::Task,_std::allocator<wasm::Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
           ).
           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           stack.flexible.
           super__Vector_base<wasm::Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::Task,_std::allocator<wasm::Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::Task>_>
           ._M_impl + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->
           super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
           ).
           super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
           stack.flexible.
           super__Vector_base<wasm::Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::Task,_std::allocator<wasm::Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::Task>_>
           ._M_impl + 0x10) = (pointer)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.currFunction
       = (Function *)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__FunctionValidator_00e218f0;
  this->info = info;
  (this->breakTypes)._M_h._M_buckets = &(this->breakTypes)._M_h._M_single_bucket;
  (this->breakTypes)._M_h._M_bucket_count = 1;
  (this->breakTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->breakTypes)._M_h._M_element_count = 0;
  (this->breakTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->breakTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->breakTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->delegateTargetNames)._M_h._M_buckets = &(this->delegateTargetNames)._M_h._M_single_bucket;
  (this->delegateTargetNames)._M_h._M_bucket_count = 1;
  (this->delegateTargetNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->delegateTargetNames)._M_h._M_element_count = 0;
  (this->delegateTargetNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->delegateTargetNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->delegateTargetNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->rethrowTargetNames)._M_h._M_buckets = &(this->rethrowTargetNames)._M_h._M_single_bucket;
  (this->rethrowTargetNames)._M_h._M_bucket_count = 1;
  (this->rethrowTargetNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rethrowTargetNames)._M_h._M_element_count = 0;
  (this->rethrowTargetNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rethrowTargetNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rethrowTargetNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->returnTypes)._M_h._M_buckets = &(this->returnTypes)._M_h._M_single_bucket;
  (this->returnTypes)._M_h._M_bucket_count = 1;
  (this->returnTypes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->returnTypes)._M_h._M_element_count = 0;
  (this->returnTypes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->returnTypes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->returnTypes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->labelNames)._M_h._M_buckets = &(this->labelNames)._M_h._M_single_bucket;
  (this->labelNames)._M_h._M_bucket_count = 1;
  (this->labelNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->labelNames)._M_h._M_element_count = 0;
  (this->labelNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->labelNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->labelNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
  ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
  super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.currModule =
       wasm;
  return;
}

Assistant:

FunctionValidator(Module& wasm, ValidationInfo* info) : info(*info) {
    setModule(&wasm);
  }